

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O3

ProcessorRef * __thiscall
soul::PoolAllocator::allocate<soul::AST::ProcessorRef,soul::AST::Context&,soul::AST::ProcessorBase&>
          (PoolAllocator *this,Context *args,ProcessorBase *args_1)

{
  SourceCodeText *pSVar1;
  Scope *pSVar2;
  PoolItem *pPVar3;
  
  pPVar3 = allocateSpaceForObject(this,0x38);
  *(undefined4 *)&pPVar3->field_0x18 = 0x2c;
  pSVar1 = (args->location).sourceCode.object;
  pPVar3[1].size = (size_t)pSVar1;
  if (pSVar1 != (SourceCodeText *)0x0) {
    (pSVar1->super_RefCountedObject).refCount = (pSVar1->super_RefCountedObject).refCount + 1;
  }
  pSVar2 = args->parentScope;
  pPVar3[1].destructor = (DestructorFn *)(args->location).location.data;
  pPVar3[1].item = pSVar2;
  *(undefined4 *)&pPVar3[1].field_0x18 = 3;
  pPVar3->item = &PTR__ASTObject_002f7fa8;
  pPVar3[2].size = (size_t)args_1;
  pPVar3->destructor =
       allocate<soul::AST::ProcessorRef,_soul::AST::Context_&,_soul::AST::ProcessorBase_&>::
       anon_class_1_0_00000001::__invoke;
  return (ProcessorRef *)&pPVar3->item;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }